

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

int __thiscall
AbstractModuleClient::processEventMsg
          (AbstractModuleClient *this,char *sender,char *event,TrodesMsg *msg)

{
  allocator local_5a;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,sender,&local_59);
  std::__cxx11::string::string(local_58,event,&local_5a);
  (*(this->super_MlmWrap)._vptr_MlmWrap[0x10])(this,local_38,local_58,msg);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int AbstractModuleClient::processEventMsg(const char *sender, const char *event, TrodesMsg &msg) {
    int rc = 0;
//    std::cout << "got event msg with " << msg.numContents() << "frames\n";
    recv_event(sender, event, msg);
    return rc;
}